

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O0

Vec_Int_t * Proof_CollectUsedRec(Vec_Set_t *vProof,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *vUsed_00;
  undefined4 local_24;
  int Entry;
  int i;
  Vec_Int_t *vUsed;
  Vec_Int_t *vRoots_local;
  Vec_Set_t *vProof_local;
  
  vUsed_00 = Vec_IntAlloc(1000);
  for (local_24 = 0; iVar1 = Vec_IntSize(vRoots), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vRoots,local_24);
    if (-1 < iVar1) {
      Proof_CollectUsed_rec(vProof,iVar1,vUsed_00);
    }
  }
  return vUsed_00;
}

Assistant:

Vec_Int_t * Proof_CollectUsedRec( Vec_Set_t * vProof, Vec_Int_t * vRoots )
{
    Vec_Int_t * vUsed;
    int i, Entry;
    vUsed = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRoots, Entry, i )
        if ( Entry >= 0 )
            Proof_CollectUsed_rec( vProof, Entry, vUsed );
    return vUsed;
}